

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxscaler.hpp
# Opt level: O2

void __thiscall
soplex::
SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::unscaleSlacks(SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *this,SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      *lp,
               VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *s)

{
  undefined8 *puVar1;
  pointer pnVar2;
  long lVar3;
  long lVar4;
  undefined8 *puVar5;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
  *pnVar6;
  soplex *psVar7;
  uint *puVar8;
  int i;
  long lVar9;
  byte bVar10;
  soplex local_130 [112];
  undefined4 local_c0;
  undefined1 local_bc;
  undefined8 local_b8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
  local_b0;
  
  bVar10 = 0;
  lVar4 = 0x1e;
  for (lVar9 = 0;
      pnVar2 = (s->val).
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
      lVar9 < (int)((ulong)((long)(s->val).
                                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish - (long)pnVar2) >> 7);
      lVar9 = lVar9 + 1) {
    puVar1 = (undefined8 *)((long)&(pnVar2->m_backend).data + lVar4 * 4);
    puVar5 = puVar1 + -0xf;
    psVar7 = local_130;
    for (lVar3 = 0x1c; lVar3 != 0; lVar3 = lVar3 + -1) {
      *(undefined4 *)psVar7 = *(undefined4 *)puVar5;
      puVar5 = (undefined8 *)((long)puVar5 + (ulong)bVar10 * -8 + 4);
      psVar7 = psVar7 + (ulong)bVar10 * -8 + 4;
    }
    local_c0 = *(undefined4 *)(puVar1 + -1);
    local_bc = *(undefined1 *)((long)puVar1 + -4);
    local_b8 = *puVar1;
    spxLdexp<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>
              (&local_b0,local_130,
               (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)(ulong)(uint)-(lp->
                                super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                ).scaleExp.data[lVar9],
               CONCAT31((int3)((uint)local_c0 >> 8),local_bc));
    puVar1 = (undefined8 *)
             ((long)&(((s->val).
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->m_backend).data + lVar4 * 4);
    pnVar6 = &local_b0;
    puVar8 = (uint *)(puVar1 + -0xf);
    for (lVar3 = 0x1c; lVar3 != 0; lVar3 = lVar3 + -1) {
      *puVar8 = (pnVar6->m_backend).data._M_elems[0];
      pnVar6 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
                *)((long)pnVar6 + ((ulong)bVar10 * -2 + 1) * 4);
      puVar8 = puVar8 + (ulong)bVar10 * -2 + 1;
    }
    *(int *)(puVar1 + -1) = local_b0.m_backend.exp;
    *(bool *)((long)puVar1 + -4) = local_b0.m_backend.neg;
    *puVar1 = local_b0.m_backend._120_8_;
    lVar4 = lVar4 + 0x20;
  }
  return;
}

Assistant:

void SPxScaler<R>::unscaleSlacks(const SPxLPBase<R>& lp, VectorBase<R>& s) const
{
   assert(lp.isScaled());

   const DataArray < int >& rowscaleExp = lp.LPRowSetBase<R>::scaleExp;

   assert(s.dim() == rowscaleExp.size());

   for(int i = 0; i < s.dim(); ++i)
      s[i] = spxLdexp(s[i], -rowscaleExp[i]);
}